

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O0

void __thiscall RenX::Server::Server(Server *this,string_view configurationSection)

{
  bool bVar1;
  rep rVar2;
  undefined8 uVar3;
  EVP_PKEY_CTX *ctx;
  Core *this_00;
  vector<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_> *this_01;
  reference ppPVar4;
  __sv_type _Var5;
  Plugin **plugin;
  iterator __end1;
  iterator __begin1;
  vector<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_> *__range1;
  char *local_38;
  Server *this_local;
  string_view configurationSection_local;
  
  configurationSection_local._M_len = (size_t)configurationSection._M_str;
  this_local = (Server *)configurationSection._M_len;
  Jupiter::Thinker::Thinker(&this->super_Thinker);
  Jupiter::Rehashable::Rehashable(&this->super_Rehashable);
  (this->super_Thinker)._vptr_Thinker = (_func_int **)&PTR_think_001fa820;
  *(undefined **)&this->super_Rehashable = &DAT_001fa858;
  std::__cxx11::list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>::list(&this->players);
  std::
  vector<std::unique_ptr<RenX::BuildingInfo,_std::default_delete<RenX::BuildingInfo>_>,_std::allocator<std::unique_ptr<RenX::BuildingInfo,_std::default_delete<RenX::BuildingInfo>_>_>_>
  ::vector(&this->buildings);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->mutators);
  std::vector<RenX::Map,_std::allocator<RenX::Map>_>::vector(&this->maps);
  Jupiter::Config::Config(&this->varData);
  this->m_gameover_when_empty = false;
  this->m_gameover_pending = false;
  this->m_pure = false;
  this->m_connected = false;
  this->m_subscribed = false;
  this->m_fully_connected = false;
  this->m_seamless = false;
  this->m_firstKill = false;
  this->m_firstDeath = false;
  this->m_firstAction = false;
  this->m_awaitingPong = false;
  this->m_passworded = false;
  this->m_steamRequired = false;
  this->m_privateMessageTeamOnly = false;
  this->m_allowPrivateMessaging = true;
  this->m_spawnCrates = true;
  this->m_botsEnabled = true;
  this->m_competitive = false;
  this->m_devBot = false;
  this->m_reliable = false;
  this->m_ranked = false;
  this->m_team_mode = 3;
  this->m_match_state = 1;
  this->m_game_type = 1;
  this->m_attempts = 0;
  this->m_playerLimit = 0;
  this->m_vehicleLimit = 0;
  this->m_mineLimit = 0;
  this->m_timeLimit = 0;
  this->m_bot_count = 0;
  this->m_player_rdns_resolutions_pending = 0;
  this->m_rconVersion = 0;
  this->m_gameVersionNumber = 0;
  this->m_crateRespawnAfterPickup = 0.0;
  rVar2 = std::chrono::_V2::steady_clock::now();
  (this->m_lastAttempt).__d.__r = rVar2;
  rVar2 = std::chrono::_V2::steady_clock::now();
  (this->m_gameStart).__d.__r = rVar2;
  rVar2 = std::chrono::_V2::steady_clock::now();
  (this->m_lastClientListUpdate).__d.__r = rVar2;
  rVar2 = std::chrono::_V2::steady_clock::now();
  (this->m_lastBuildingListUpdate).__d.__r = rVar2;
  rVar2 = std::chrono::_V2::steady_clock::now();
  (this->m_lastActivity).__d.__r = rVar2;
  rVar2 = std::chrono::_V2::steady_clock::now();
  (this->m_lastSendActivity).__d.__r = rVar2;
  std::chrono::
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(&this->m_gameover_time);
  std::__cxx11::string::string((string *)&this->m_lastLine);
  std::__cxx11::string::string((string *)&this->m_rconUser);
  std::__cxx11::string::string((string *)&this->m_gameVersion);
  std::__cxx11::string::string((string *)&this->m_serverName);
  std::__cxx11::string::string((string *)&this->m_lastCommand);
  std::__cxx11::string::string((string *)&this->m_lastCommandParams);
  Map::Map(&this->m_map);
  Jupiter::TCPSocket::TCPSocket(&this->m_sock);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->m_commandListFormat);
  std::
  vector<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>,_std::allocator<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>_>_>
  ::vector(&this->m_commands);
  std::__cxx11::string::string((string *)&this->m_clientHostname);
  std::__cxx11::string::string((string *)&this->m_hostname);
  std::__cxx11::string::string((string *)&this->m_pass);
  std::__cxx11::string::string((string *)&this->m_configSection);
  std::__cxx11::string::string((string *)&this->m_rules);
  std::__cxx11::string::string((string *)&this->m_ban_from_str);
  std::__cxx11::string::string((string *)&this->m_IRCPrefix);
  std::__cxx11::string::string((string *)&this->m_CommandPrefix);
  std::__cxx11::string::operator=
            ((string *)&this->m_configSection,
             (basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  this->m_calc_uuid = default_uuid_func_abi_cxx11_;
  getCore();
  uVar3 = Jupiter::Plugin::getConfig();
  _Var5 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&this->m_configSection)
  ;
  __range1 = (vector<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_> *)_Var5._M_len;
  local_38 = _Var5._M_str;
  ctx = (EVP_PKEY_CTX *)Jupiter::Config::getSection(uVar3,__range1,local_38);
  init(this,ctx);
  this_00 = getCore();
  this_01 = Core::getPlugins(this_00);
  __end1 = std::vector<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_>::begin(this_01);
  plugin = (Plugin **)std::vector<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_>::end(this_01);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<RenX::Plugin_**,_std::vector<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_>_>
                      (&__end1,(__normal_iterator<RenX::Plugin_**,_std::vector<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_>_>
                                *)&plugin);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppPVar4 = __gnu_cxx::
              __normal_iterator<RenX::Plugin_**,_std::vector<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_>_>
              ::operator*(&__end1);
    (**(code **)(*(long *)*ppPVar4 + 0x118))(*ppPVar4,this);
    __gnu_cxx::
    __normal_iterator<RenX::Plugin_**,_std::vector<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

RenX::Server::Server(std::string_view configurationSection) {
	m_configSection = configurationSection;
	m_calc_uuid = RenX::default_uuid_func;
	init(*RenX::getCore()->getConfig().getSection(m_configSection));
	for (const auto& plugin : RenX::getCore()->getPlugins()) {
		plugin->RenX_OnServerCreate(*this);
	}
}